

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall
spv::Builder::createFunctionCall
          (Builder *this,Function *function,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *args)

{
  int iVar1;
  Id IVar2;
  Id typeId;
  Instruction *pIVar3;
  size_type sVar4;
  const_reference pvVar5;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_38;
  int local_2c;
  Instruction *pIStack_28;
  int a;
  Instruction *op;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *args_local;
  Function *function_local;
  Builder *this_local;
  
  op = (Instruction *)args;
  args_local = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)function;
  function_local = (Function *)this;
  pIVar3 = (Instruction *)::operator_new(0x60);
  IVar2 = getUniqueId(this);
  typeId = spv::Function::getReturnType((Function *)args_local);
  spv::Instruction::Instruction(pIVar3,IVar2,typeId,OpFunctionCall);
  pIStack_28 = pIVar3;
  sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)op);
  spv::Instruction::reserveOperands(pIVar3,sVar4 + 1);
  pIVar3 = pIStack_28;
  IVar2 = spv::Function::getId((Function *)args_local);
  spv::Instruction::addIdOperand(pIVar3,IVar2);
  local_2c = 0;
  while( true ) {
    iVar1 = local_2c;
    sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)op);
    pIVar3 = pIStack_28;
    if ((int)sVar4 <= iVar1) break;
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)op,(long)local_2c);
    spv::Instruction::addIdOperand(pIVar3,*pvVar5);
    local_2c = local_2c + 1;
  }
  std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
  unique_ptr<std::default_delete<spv::Instruction>,void>
            ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_38,
             pIStack_28);
  addInstruction(this,&local_38);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&local_38);
  IVar2 = spv::Instruction::getResultId(pIStack_28);
  return IVar2;
}

Assistant:

Id Builder::createFunctionCall(spv::Function* function, const std::vector<spv::Id>& args)
{
    Instruction* op = new Instruction(getUniqueId(), function->getReturnType(), OpFunctionCall);
    op->reserveOperands(args.size() + 1);
    op->addIdOperand(function->getId());
    for (int a = 0; a < (int)args.size(); ++a)
        op->addIdOperand(args[a]);
    addInstruction(std::unique_ptr<Instruction>(op));

    return op->getResultId();
}